

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2tt.cpp
# Opt level: O1

void ConstructTtPath::Finish(json *quadContour)

{
  size_type idx;
  value_t vVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  size_t sVar7;
  double dVar8;
  double dVar9;
  bool ret;
  Point p3;
  Point p2;
  Point p1;
  boolean_t local_81;
  Point local_80;
  Point local_70;
  Point local_60;
  double local_50;
  Point local_48;
  Point local_38;
  
  vVar1 = quadContour->m_type;
  sVar7 = (size_t)vVar1;
  if (vVar1 != null) {
    if (vVar1 == object) {
      sVar7 = (((quadContour->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    }
    else if (vVar1 == array) {
      sVar7 = (long)(((quadContour->m_value).array)->
                    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(((quadContour->m_value).array)->
                    super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4;
    }
    else {
      sVar7 = 1;
    }
  }
  if (1 < sVar7) {
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](quadContour,0);
    Point::Point(&local_38,pvVar5);
    idx = sVar7 - 1;
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](quadContour,idx);
    Point::Point(&local_48,pvVar5);
    dVar8 = (local_38.x - local_48.x) * (local_38.x - local_48.x) +
            (local_38.y - local_48.y) * (local_38.y - local_48.y);
    if (dVar8 < 0.0) {
      dVar8 = sqrt(dVar8);
    }
    else {
      dVar8 = SQRT(dVar8);
    }
    if (dVar8 < 1.0) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::erase(quadContour,idx);
      sVar7 = idx;
    }
  }
  if (2 < sVar7) {
    pvVar5 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](quadContour,1);
    pvVar5 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar5,"on");
    pvVar6 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator[](quadContour,sVar7 - 1);
    pvVar6 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)pvVar6,"on");
    bVar3 = nlohmann::operator==(pvVar5,pvVar6);
    if (bVar3) {
      pvVar5 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](quadContour,1);
      Point::Point(&local_60,pvVar5);
      pvVar5 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](quadContour,0);
      Point::Point(&local_70,pvVar5);
      pvVar5 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](quadContour,sVar7 - 1);
      Point::Point(&local_80,pvVar5);
      pvVar5 = nlohmann::
               basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               ::operator[](quadContour,1);
      pvVar5 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)pvVar5,"on");
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                (pvVar5,&local_81);
      if (local_81 == true) {
        dVar8 = local_80.y - local_60.y;
        dVar9 = local_60.x - local_80.x;
        iVar4 = (int)(local_70.x * dVar8 + local_70.y * dVar9 +
                     (local_60.y * local_80.x - local_80.y * local_60.x));
        iVar2 = -iVar4;
        if (0 < iVar4) {
          iVar2 = iVar4;
        }
        dVar9 = dVar8 * dVar8 + dVar9 * dVar9;
        if (dVar9 < 0.0) {
          local_50 = (double)iVar2;
          dVar9 = sqrt(dVar9);
          dVar8 = local_50;
        }
        else {
          dVar9 = SQRT(dVar9);
          dVar8 = (double)iVar2;
        }
        dVar8 = dVar8 / dVar9;
      }
      else {
        local_70.x = (local_60.x + local_80.x) * 0.5 - local_70.x;
        local_70.y = (local_60.y + local_80.y) * 0.5 - local_70.y;
        dVar8 = local_70.x * local_70.x + local_70.y * local_70.y;
        if (dVar8 < 0.0) {
          dVar8 = sqrt(dVar8);
        }
        else {
          dVar8 = SQRT(dVar8);
        }
      }
      if (dVar8 < 1.0) {
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::erase(quadContour,0);
      }
    }
  }
  return;
}

Assistant:

void Finish(json &quadContour)
{
	size_t length = quadContour.size();
	// quadContour[0] and quadContour[-1] are implicitly on-curve
	if (length >= 2 && abs(Point(quadContour[0]) - quadContour[length - 1]) < 1)
	{
		quadContour.erase(length - 1);
		length--;
	}
	if (length <= 2)
		return;
	if (quadContour[1]["on"] != quadContour[length - 1]["on"])
		// first point is tangent point, do nothing
		return;
	Point p1 = quadContour[1];
	Point p2 = quadContour[0];
	Point p3 = quadContour[length - 1];
	if (quadContour[1]["on"])
	{
		// 2 lines, merge if the are collinear.
		double a = p3.y - p1.y;
		double b = p1.x - p3.x;
		double c = p1.y * p3.x - p1.x * p3.y;
		double distance = abs(a * p2.x + b * p2.y + c) / sqrt(a * a + b * b);
		if (distance < 1)
			quadContour.erase(0);
	}
	else if (abs((p1 + p3) / 2 - p2) < 1)
		// 2 curves, remove on-curve point if it is the center point
		quadContour.erase(0);
}